

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mouse_cursor.c
# Opt level: O1

_Bool al_set_system_mouse_cursor(ALLEGRO_DISPLAY *display,ALLEGRO_SYSTEM_MOUSE_CURSOR cursor_id)

{
  _Bool _Var1;
  
  if (display == (ALLEGRO_DISPLAY *)0x0 ||
      cursor_id + ~ALLEGRO_NUM_SYSTEM_MOUSE_CURSORS < 0xffffffec) {
    return false;
  }
  _Var1 = (*display->vt->set_system_mouse_cursor)(display,cursor_id);
  return _Var1;
}

Assistant:

bool al_set_system_mouse_cursor(ALLEGRO_DISPLAY *display,
   ALLEGRO_SYSTEM_MOUSE_CURSOR cursor_id)
{
   /* XXX should you be able to set ALLEGRO_SYSTEM_MOUSE_CURSOR_NONE? */
   ASSERT(cursor_id > ALLEGRO_SYSTEM_MOUSE_CURSOR_NONE);
   ASSERT(cursor_id < ALLEGRO_NUM_SYSTEM_MOUSE_CURSORS);
   ASSERT(display);

   if (cursor_id <= ALLEGRO_SYSTEM_MOUSE_CURSOR_NONE) {
      return false;
   }
   if (cursor_id > ALLEGRO_NUM_SYSTEM_MOUSE_CURSORS) {
      return false;
   }
   if (!display) {
      return false;
   }

   ASSERT(display->vt->set_system_mouse_cursor);
   return display->vt->set_system_mouse_cursor(display, cursor_id);
}